

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O2

uint32_t virtio_rx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  uint32_t uVar1;
  uint *puVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  pkt_buf *ppVar6;
  uint uVar7;
  ushort uVar8;
  long lVar9;
  ulong uVar10;
  
  puVar2 = (uint *)ixy[1].driver_name;
  for (uVar10 = 0; num_bufs != uVar10; uVar10 = uVar10 + 1) {
    uVar8 = (ushort)puVar2[10];
    lVar3 = *(long *)(puVar2 + 6);
    if (uVar8 == *(ushort *)(lVar3 + 2)) goto LAB_00105552;
    uVar4 = (ulong)uVar8 % (ulong)*puVar2;
    uVar7 = *(uint *)(lVar3 + 4 + uVar4 * 8);
    *(ushort *)(puVar2 + 10) = uVar8 + 1;
    lVar9 = (ulong)uVar7 * 0x10;
    if (*(short *)(*(long *)(puVar2 + 2) + 0xc + lVar9) != 2) {
      fprintf(_stderr,"[ERROR] %s:%d %s(): unsupported rx flags on descriptor: %x\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x17d,"virtio_rx_batch");
      abort();
    }
    puVar5 = (undefined8 *)(*(long *)(puVar2 + 2) + lVar9);
    *puVar5 = 0;
    puVar5[1] = 0;
    ppVar6 = *(pkt_buf **)(puVar2 + (ulong)*(uint *)(lVar3 + 4 + uVar4 * 8) * 2 + 0xe);
    uVar7 = *(int *)(lVar3 + 8 + uVar4 * 8) - 10;
    ppVar6->size = uVar7;
    bufs[uVar10] = ppVar6;
    ixy[1].set_promisc = ixy[1].set_promisc + uVar7;
    ixy[1].tx_batch = ixy[1].tx_batch + 1;
  }
  uVar10 = (ulong)num_bufs;
LAB_00105552:
  uVar8 = 0;
  do {
    if (*puVar2 <= (uint)uVar8) {
      return (uint32_t)uVar10;
    }
    if (*(long *)(*(long *)(puVar2 + 2) + (ulong)uVar8 * 0x10) == 0) {
      ppVar6 = pkt_buf_alloc(*(mempool **)(puVar2 + 0xc));
      if (ppVar6 == (pkt_buf *)0x0) {
        fprintf(_stderr,
                "[ERROR] %s:%d %s(): failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small\n"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0x196,"virtio_rx_batch");
        abort();
      }
      lVar9 = (ulong)uVar8 * 0x10;
      uVar1 = *(uint32_t *)(*(long *)(puVar2 + 0xc) + 8);
      ppVar6->size = uVar1;
      ppVar6->head_room[0x1e] = '\0';
      ppVar6->head_room[0x1f] = '\0';
      ppVar6->head_room[0x20] = '*';
      ppVar6->head_room[0x21] = '\0';
      ppVar6->head_room[0x22] = '\0';
      ppVar6->head_room[0x23] = '\0';
      ppVar6->head_room[0x24] = '\0';
      ppVar6->head_room[0x25] = '\0';
      ppVar6->head_room[0x26] = '\0';
      ppVar6->head_room[0x27] = '\0';
      lVar3 = *(long *)(puVar2 + 2);
      *(uint32_t *)(lVar3 + 8 + lVar9) = uVar1 + 10;
      *(uintptr_t *)(lVar3 + lVar9) = ppVar6->buf_addr_phy + 0x36;
      *(undefined4 *)(lVar3 + 0xc + lVar9) = 2;
      *(pkt_buf **)(puVar2 + (ulong)uVar8 * 2 + 0xe) = ppVar6;
      *(ushort *)
       (*(long *)(puVar2 + 4) + 4 +
       ((ulong)*(ushort *)(*(long *)(puVar2 + 4) + 2) % (ulong)*puVar2) * 2) = uVar8;
      *(short *)(*(long *)(puVar2 + 4) + 2) = *(short *)(*(long *)(puVar2 + 4) + 2) + 1;
      virtio_legacy_notify_queue((virtio_device *)ixy,0);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

uint32_t virtio_rx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct virtio_device* dev = IXY_TO_VIRTIO(ixy);
	struct virtqueue* vq = dev->rx_queue;
	uint32_t buf_idx;

	_mm_mfence();
	// Retrieve used bufs from the device
	for (buf_idx = 0; buf_idx < num_bufs; ++buf_idx) {
		// Section 3.2.2
		if (vq->vq_used_last_idx == vq->vring.used->idx) {
			break;
		}
		// info("Rx packet: last used %u, used idx %u", vq->vq_used_last_idx,
		// vq->vring.used->idx);
		struct vring_used_elem* e = vq->vring.used->ring + (vq->vq_used_last_idx % vq->vring.num);
		// info("Used elem %p, id %u len %u", e, e->id, e->len);
		struct vring_desc* desc = &vq->vring.desc[e->id];
		vq->vq_used_last_idx++;
		// We don't support chaining or indirect descriptors
		if (desc->flags != VRING_DESC_F_WRITE) {
			error("unsupported rx flags on descriptor: %x", desc->flags);
		}
		// info("Desc %lu %u %u %u", desc->addr, desc->len, desc->flags,
		// desc->next);
		*desc = (struct vring_desc){};

		// Section 5.1.6.4
		struct pkt_buf* buf = vq->virtual_addresses[e->id];
		buf->size = e->len - sizeof(net_hdr);
		bufs[buf_idx] = buf;
		//struct virtio_net_hdr* hdr = (void*)(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr));

		// Update rx counter
		dev->rx_bytes += buf->size;
		dev->rx_pkts++;
	}
	// Fill empty slots in descriptor table
	for (uint16_t idx = 0; idx < vq->vring.num; ++idx) {
		struct vring_desc* desc = &vq->vring.desc[idx];
		if (desc->addr != 0) { // descriptor points to something, therefore it is in use
			continue;
		}
		// info("Found free desc slot at %u (%u)", idx, vq->vring.num);
		struct pkt_buf* buf = pkt_buf_alloc(vq->mempool);
		if (!buf) {
			error("failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small");
		}
		buf->size = vq->mempool->buf_size;
		memcpy(buf->head_room + sizeof(buf->head_room) - sizeof(net_hdr), &net_hdr, sizeof(net_hdr));
		vq->vring.desc[idx].len = buf->size + sizeof(net_hdr);
		vq->vring.desc[idx].addr =
			buf->buf_addr_phy + offsetof(struct pkt_buf, head_room) + sizeof(buf->head_room) - sizeof(net_hdr);
		vq->vring.desc[idx].flags = VRING_DESC_F_WRITE;
		vq->vring.desc[idx].next = 0;
		vq->virtual_addresses[idx] = buf;
		vq->vring.avail->ring[vq->vring.avail->idx % vq->vring.num] = idx;
		_mm_mfence(); // Make sure exposed descriptors reach device before index is updated
		vq->vring.avail->idx++;
		_mm_mfence(); // Make sure the index update reaches device before it is triggered
		virtio_legacy_notify_queue(dev, 0);
	}
	return buf_idx;
}